

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahrens_beylkin.hpp
# Opt level: O1

tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
* IntegratorXX::quadrature_traits<IntegratorXX::AhrensBeylkin<double>,_void>::generate
            (tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             *__return_storage_ptr__,size_t npts)

{
  size_t __n;
  array<double,_372UL> *__src;
  weight_container weights;
  point_container points;
  vector<double,_std::allocator<double>_> local_48;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> local_30;
  allocator_type local_11;
  
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            (&local_30,npts,(allocator_type *)&local_48);
  std::vector<double,_std::allocator<double>_>::vector(&local_48,npts,&local_11);
  if ((long)npts < 0x8b8) {
    if ((long)npts < 0x408) {
      if ((long)npts < 0x228) {
        if ((long)npts < 0x138) {
          if (npts == 0x48) {
            memcpy(local_30.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   &AhrensBeylkinGrids::ahrens_beylkin_72<double>::points,0x6c0);
            __n = 0x240;
            __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_72<double>::weights;
          }
          else if (npts == 0x84) {
            memcpy(local_30.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   &AhrensBeylkinGrids::ahrens_beylkin_132<double>::points,0xc60);
            __n = 0x420;
            __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_132<double>::weights
            ;
          }
          else {
            if (npts != 0xc0) goto LAB_0013a91b;
            memcpy(local_30.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   &AhrensBeylkinGrids::ahrens_beylkin_192<double>::points,0x1200);
            __n = 0x600;
            __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_192<double>::weights
            ;
          }
        }
        else if ((long)npts < 0x1b0) {
          if (npts == 0x138) {
            memcpy(local_30.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   &AhrensBeylkinGrids::ahrens_beylkin_312<double>::points,0x1d40);
            __n = 0x9c0;
            __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_312<double>::weights
            ;
          }
          else {
            if (npts != 0x174) goto LAB_0013a91b;
            memcpy(local_30.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   &AhrensBeylkinGrids::ahrens_beylkin_372<double>::points,0x22e0);
            __src = &AhrensBeylkinGrids::ahrens_beylkin_372<double>::weights;
            __n = 0xba0;
          }
        }
        else if (npts == 0x1b0) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_432<double>::points,0x2880);
          __n = 0xd80;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_432<double>::weights;
        }
        else {
          if (npts != 0x1ec) goto LAB_0013a91b;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_492<double>::points,0x2e20);
          __n = 0xf60;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_492<double>::weights;
        }
      }
      else if ((long)npts < 0x2dc) {
        if (npts == 0x228) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_552<double>::points,0x33c0);
          __n = 0x1140;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_552<double>::weights;
        }
        else if (npts == 0x264) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_612<double>::points,0x3960);
          __n = 0x1320;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_612<double>::weights;
        }
        else {
          if (npts != 0x2a0) goto LAB_0013a91b;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_672<double>::points,0x3f00);
          __n = 0x1500;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_672<double>::weights;
        }
      }
      else if ((long)npts < 0x390) {
        if (npts == 0x2dc) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_732<double>::points,0x44a0);
          __n = 0x16e0;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_732<double>::weights;
        }
        else {
          if (npts != 0x318) goto LAB_0013a91b;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_792<double>::points,0x4a40);
          __n = 0x18c0;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_792<double>::weights;
        }
      }
      else if (npts == 0x390) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_912<double>::points,0x5580);
        __n = 0x1c80;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_912<double>::weights;
      }
      else {
        if (npts != 0x3cc) goto LAB_0013a91b;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_972<double>::points,0x5b20);
        __n = 0x1e60;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_972<double>::weights;
      }
    }
    else if ((long)npts < 0x660) {
      if ((long)npts < 0x534) {
        if (npts == 0x408) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_1032<double>::points,0x60c0);
          __n = 0x2040;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1032<double>::weights;
        }
        else if (npts == 0x444) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_1092<double>::points,0x6660);
          __n = 0x2220;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1092<double>::weights;
        }
        else {
          if (npts != 0x4f8) goto LAB_0013a91b;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_1272<double>::points,0x7740);
          __n = 0x27c0;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1272<double>::weights;
        }
      }
      else if ((long)npts < 0x5e8) {
        if (npts == 0x534) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_1332<double>::points,0x7ce0);
          __n = 0x29a0;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1332<double>::weights;
        }
        else {
          if (npts != 0x570) goto LAB_0013a91b;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_1392<double>::points,0x8280);
          __n = 0x2b80;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1392<double>::weights;
        }
      }
      else if (npts == 0x5e8) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_1512<double>::points,0x8dc0);
        __n = 0x2f40;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1512<double>::weights;
      }
      else {
        if (npts != 0x624) goto LAB_0013a91b;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_1572<double>::points,0x9360);
        __n = 0x3120;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1572<double>::weights;
      }
    }
    else if ((long)npts < 0x78c) {
      if (npts == 0x660) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_1632<double>::points,0x9900);
        __n = 0x3300;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1632<double>::weights;
      }
      else if (npts == 0x69c) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_1692<double>::points,0x9ea0);
        __n = 0x34e0;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1692<double>::weights;
      }
      else {
        if (npts != 0x714) goto LAB_0013a91b;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_1812<double>::points,0xa9e0);
        __n = 0x38a0;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1812<double>::weights;
      }
    }
    else if ((long)npts < 0x840) {
      if (npts == 0x78c) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_1932<double>::points,0xb520);
        __n = 0x3c60;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1932<double>::weights;
      }
      else {
        if (npts != 0x7c8) goto LAB_0013a91b;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_1992<double>::points,0xbac0);
        __n = 0x3e40;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_1992<double>::weights;
      }
    }
    else if (npts == 0x840) {
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &AhrensBeylkinGrids::ahrens_beylkin_2112<double>::points,0xc600);
      __n = 0x4200;
      __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_2112<double>::weights;
    }
    else {
      if (npts != 0x87c) goto LAB_0013a91b;
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &AhrensBeylkinGrids::ahrens_beylkin_2172<double>::points,0xcba0);
      __n = 0x43e0;
      __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_2172<double>::weights;
    }
  }
  else if ((long)npts < 0x1074) {
    if ((long)npts < 0xbc4) {
      if ((long)npts < 0x9a8) {
        if (npts == 0x8b8) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_2232<double>::points,0xd140);
          __n = 0x45c0;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_2232<double>::weights;
        }
        else if (npts == 0x8f4) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_2292<double>::points,0xd6e0);
          __n = 0x47a0;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_2292<double>::weights;
        }
        else {
          if (npts != 0x96c) goto LAB_0013a91b;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_2412<double>::points,0xe220);
          __n = 0x4b60;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_2412<double>::weights;
        }
      }
      else if ((long)npts < 0xad4) {
        if (npts == 0x9a8) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_2472<double>::points,0xe7c0);
          __n = 0x4d40;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_2472<double>::weights;
        }
        else {
          if (npts != 0xa98) goto LAB_0013a91b;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &AhrensBeylkinGrids::ahrens_beylkin_2712<double>::points,0xfe40);
          __n = 0x54c0;
          __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_2712<double>::weights;
        }
      }
      else if (npts == 0xad4) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_2772<double>::points,0x103e0);
        __n = 0x56a0;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_2772<double>::weights;
      }
      else {
        if (npts != 0xb10) goto LAB_0013a91b;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_2832<double>::points,0x10980);
        __n = 0x5880;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_2832<double>::weights;
      }
    }
    else if ((long)npts < 0xd68) {
      if (npts == 0xbc4) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_3012<double>::points,0x11a60);
        __n = 0x5e20;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_3012<double>::weights;
      }
      else if (npts == 0xcf0) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_3312<double>::points,0x13680);
        __n = 0x6780;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_3312<double>::weights;
      }
      else {
        if (npts != 0xd2c) goto LAB_0013a91b;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_3372<double>::points,0x13c20);
        __n = 0x6960;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_3372<double>::weights;
      }
    }
    else if ((long)npts < 0xe1c) {
      if (npts == 0xd68) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_3432<double>::points,0x141c0);
        __n = 0x6b40;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_3432<double>::weights;
      }
      else {
        if (npts != 0xda4) goto LAB_0013a91b;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_3492<double>::points,0x14760);
        __n = 0x6d20;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_3492<double>::weights;
      }
    }
    else if (npts == 0xe1c) {
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &AhrensBeylkinGrids::ahrens_beylkin_3612<double>::points,0x152a0);
      __n = 0x70e0;
      __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_3612<double>::weights;
    }
    else {
      if (npts != 0xed0) goto LAB_0013a91b;
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &AhrensBeylkinGrids::ahrens_beylkin_3792<double>::points,0x16380);
      __n = 0x7680;
      __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_3792<double>::weights;
    }
  }
  else if ((long)npts < 0x15d8) {
    if ((long)npts < 0x1254) {
      if (npts == 0x1074) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_4212<double>::points,0x18ae0);
        __n = 0x83a0;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_4212<double>::weights;
      }
      else if (npts == 0x10ec) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_4332<double>::points,0x19620);
        __n = 0x8760;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_4332<double>::weights;
      }
      else {
        if (npts != 0x11dc) goto LAB_0013a91b;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_4572<double>::points,0x1aca0);
        __n = 0x8ee0;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_4572<double>::weights;
      }
    }
    else if ((long)npts < 0x1470) {
      if (npts == 0x1254) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_4692<double>::points,0x1b7e0);
        __n = 0x92a0;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_4692<double>::weights;
      }
      else {
        if (npts != 0x1380) goto LAB_0013a91b;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &AhrensBeylkinGrids::ahrens_beylkin_4992<double>::points,0x1d400);
        __n = 0x9c00;
        __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_4992<double>::weights;
      }
    }
    else if (npts == 0x1470) {
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &AhrensBeylkinGrids::ahrens_beylkin_5232<double>::points,0x1ea80);
      __n = 0xa380;
      __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_5232<double>::weights;
    }
    else {
      if (npts != 0x1560) goto LAB_0013a91b;
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &AhrensBeylkinGrids::ahrens_beylkin_5472<double>::points,0x20100);
      __n = 0xab00;
      __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_5472<double>::weights;
    }
  }
  else if ((long)npts < 0x18a8) {
    if (npts == 0x15d8) {
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &AhrensBeylkinGrids::ahrens_beylkin_5592<double>::points,0x20c40);
      __n = 0xaec0;
      __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_5592<double>::weights;
    }
    else if (npts == 0x168c) {
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &AhrensBeylkinGrids::ahrens_beylkin_5772<double>::points,0x21d20);
      __n = 0xb460;
      __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_5772<double>::weights;
    }
    else {
      if (npts != 0x1830) goto LAB_0013a91b;
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &AhrensBeylkinGrids::ahrens_beylkin_6192<double>::points,0x24480);
      __n = 0xc180;
      __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_6192<double>::weights;
    }
  }
  else if ((long)npts < 0x1d58) {
    if (npts == 0x18a8) {
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &AhrensBeylkinGrids::ahrens_beylkin_6312<double>::points,0x24fc0);
      __n = 0xc540;
      __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_6312<double>::weights;
    }
    else {
      if (npts != 0x1b00) goto LAB_0013a91b;
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &AhrensBeylkinGrids::ahrens_beylkin_6912<double>::points,0x28800);
      __n = 0xd800;
      __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_6912<double>::weights;
    }
  }
  else if (npts == 0x1d58) {
    memcpy(local_30.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start,
           &AhrensBeylkinGrids::ahrens_beylkin_7512<double>::points,0x2c040);
    __n = 0xeac0;
    __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_7512<double>::weights;
  }
  else {
    if (npts != 0x3aa4) goto LAB_0013a91b;
    memcpy(local_30.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start,
           &AhrensBeylkinGrids::ahrens_beylkin_15012<double>::points,0x57f60);
    __n = 0x1d520;
    __src = (array<double,_372UL> *)&AhrensBeylkinGrids::ahrens_beylkin_15012<double>::weights;
  }
  memcpy(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,__src,__n);
LAB_0013a91b:
  std::
  _Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>&,std::vector<double,std::allocator<double>>&,void>
            ((_Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              *)__return_storage_ptr__,&local_30,&local_48);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_30.
      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container, weight_container>
  generate(size_t npts) {

    point_container points(npts);
    weight_container weights(npts);

    using namespace AhrensBeylkinGrids;

    if (npts == 72)
      detail::copy_grid<ahrens_beylkin_72<RealType>>(points, weights);
    else if (npts == 132)
      detail::copy_grid<ahrens_beylkin_132<RealType>>(points, weights);
    else if (npts == 192)
      detail::copy_grid<ahrens_beylkin_192<RealType>>(points, weights);
    else if (npts == 312)
      detail::copy_grid<ahrens_beylkin_312<RealType>>(points, weights);
    else if (npts == 372)
      detail::copy_grid<ahrens_beylkin_372<RealType>>(points, weights);
    else if (npts == 432)
      detail::copy_grid<ahrens_beylkin_432<RealType>>(points, weights);
    else if (npts == 492)
      detail::copy_grid<ahrens_beylkin_492<RealType>>(points, weights);
    else if (npts == 552)
      detail::copy_grid<ahrens_beylkin_552<RealType>>(points, weights);
    else if (npts == 612)
      detail::copy_grid<ahrens_beylkin_612<RealType>>(points, weights);
    else if (npts == 672)
      detail::copy_grid<ahrens_beylkin_672<RealType>>(points, weights);
    else if (npts == 732)
      detail::copy_grid<ahrens_beylkin_732<RealType>>(points, weights);
    else if (npts == 792)
      detail::copy_grid<ahrens_beylkin_792<RealType>>(points, weights);
    else if (npts == 912)
      detail::copy_grid<ahrens_beylkin_912<RealType>>(points, weights);
    else if (npts == 972)
      detail::copy_grid<ahrens_beylkin_972<RealType>>(points, weights);
    else if (npts == 1032)
      detail::copy_grid<ahrens_beylkin_1032<RealType>>(points, weights);
    else if (npts == 1092)
      detail::copy_grid<ahrens_beylkin_1092<RealType>>(points, weights);
    else if (npts == 1272)
      detail::copy_grid<ahrens_beylkin_1272<RealType>>(points, weights);
    else if (npts == 1332)
      detail::copy_grid<ahrens_beylkin_1332<RealType>>(points, weights);
    else if (npts == 1392)
      detail::copy_grid<ahrens_beylkin_1392<RealType>>(points, weights);
    else if (npts == 1512)
      detail::copy_grid<ahrens_beylkin_1512<RealType>>(points, weights);
    else if (npts == 1572)
      detail::copy_grid<ahrens_beylkin_1572<RealType>>(points, weights);
    else if (npts == 1632)
      detail::copy_grid<ahrens_beylkin_1632<RealType>>(points, weights);
    else if (npts == 1692)
      detail::copy_grid<ahrens_beylkin_1692<RealType>>(points, weights);
    else if (npts == 1812)
      detail::copy_grid<ahrens_beylkin_1812<RealType>>(points, weights);
    else if (npts == 1932)
      detail::copy_grid<ahrens_beylkin_1932<RealType>>(points, weights);
    else if (npts == 1992)
      detail::copy_grid<ahrens_beylkin_1992<RealType>>(points, weights);
    else if (npts == 2112)
      detail::copy_grid<ahrens_beylkin_2112<RealType>>(points, weights);
    else if (npts == 2172)
      detail::copy_grid<ahrens_beylkin_2172<RealType>>(points, weights);
    else if (npts == 2232)
      detail::copy_grid<ahrens_beylkin_2232<RealType>>(points, weights);
    else if (npts == 2292)
      detail::copy_grid<ahrens_beylkin_2292<RealType>>(points, weights);
    else if (npts == 2412)
      detail::copy_grid<ahrens_beylkin_2412<RealType>>(points, weights);
    else if (npts == 2472)
      detail::copy_grid<ahrens_beylkin_2472<RealType>>(points, weights);
    else if (npts == 2712)
      detail::copy_grid<ahrens_beylkin_2712<RealType>>(points, weights);
    else if (npts == 2772)
      detail::copy_grid<ahrens_beylkin_2772<RealType>>(points, weights);
    else if (npts == 2832)
      detail::copy_grid<ahrens_beylkin_2832<RealType>>(points, weights);
    else if (npts == 3012)
      detail::copy_grid<ahrens_beylkin_3012<RealType>>(points, weights);
    else if (npts == 3312)
      detail::copy_grid<ahrens_beylkin_3312<RealType>>(points, weights);
    else if (npts == 3372)
      detail::copy_grid<ahrens_beylkin_3372<RealType>>(points, weights);
    else if (npts == 3432)
      detail::copy_grid<ahrens_beylkin_3432<RealType>>(points, weights);
    else if (npts == 3492)
      detail::copy_grid<ahrens_beylkin_3492<RealType>>(points, weights);
    else if (npts == 3612)
      detail::copy_grid<ahrens_beylkin_3612<RealType>>(points, weights);
    else if (npts == 3792)
      detail::copy_grid<ahrens_beylkin_3792<RealType>>(points, weights);
    else if (npts == 4212)
      detail::copy_grid<ahrens_beylkin_4212<RealType>>(points, weights);
    else if (npts == 4332)
      detail::copy_grid<ahrens_beylkin_4332<RealType>>(points, weights);
    else if (npts == 4572)
      detail::copy_grid<ahrens_beylkin_4572<RealType>>(points, weights);
    else if (npts == 4692)
      detail::copy_grid<ahrens_beylkin_4692<RealType>>(points, weights);
    else if (npts == 4992)
      detail::copy_grid<ahrens_beylkin_4992<RealType>>(points, weights);
    else if (npts == 5232)
      detail::copy_grid<ahrens_beylkin_5232<RealType>>(points, weights);
    else if (npts == 5472)
      detail::copy_grid<ahrens_beylkin_5472<RealType>>(points, weights);
    else if (npts == 5592)
      detail::copy_grid<ahrens_beylkin_5592<RealType>>(points, weights);
    else if (npts == 5772)
      detail::copy_grid<ahrens_beylkin_5772<RealType>>(points, weights);
    else if (npts == 6192)
      detail::copy_grid<ahrens_beylkin_6192<RealType>>(points, weights);
    else if (npts == 6312)
      detail::copy_grid<ahrens_beylkin_6312<RealType>>(points, weights);
    else if (npts == 6912)
      detail::copy_grid<ahrens_beylkin_6912<RealType>>(points, weights);
    else if (npts == 7512)
      detail::copy_grid<ahrens_beylkin_7512<RealType>>(points, weights);
    else if (npts == 15012)
      detail::copy_grid<ahrens_beylkin_15012<RealType>>(points, weights);

    return std::make_tuple(points, weights);
  }